

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O1

int MPIABI_Graph_get(MPIABI_Comm comm,int maxindex,int maxedges,int *index,int *edges)

{
  int iVar1;
  
  iVar1 = MPI_Graph_get();
  return iVar1;
}

Assistant:

int MPIABI_Graph_get(
  MPIABI_Comm comm,
  int maxindex,
  int maxedges,
  int * index,
  int * edges
) {
  return MPI_Graph_get(
    (MPI_Comm)(WPI_Comm)comm,
    maxindex,
    maxedges,
    index,
    edges
  );
}